

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O3

void __thiscall avro::BufferReader::incrementChunk(BufferReader *this,size_type howmuch)

{
  long lVar1;
  long lVar2;
  
  *(size_type *)(this + 0x38) = *(long *)(this + 0x38) - howmuch;
  lVar1 = *(long *)(this + 0x40);
  *(size_type *)(this + 0x40) = howmuch + lVar1;
  lVar2 = *(long *)(this + 0x10);
  if (howmuch + lVar1 == *(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) {
    *(undefined8 *)(this + 0x40) = 0;
    *(long *)(this + 0x10) = lVar2 + 0x38;
    if (lVar2 + 0x38 == *(long *)(this + 0x20)) {
      lVar1 = *(long *)(this + 0x28);
      *(long *)(this + 0x28) = lVar1 + 8;
      lVar1 = *(long *)(lVar1 + 8);
      *(long *)(this + 0x18) = lVar1;
      *(long *)(this + 0x20) = lVar1 + 0x1f8;
      *(long *)(this + 0x10) = lVar1;
      return;
    }
  }
  return;
}

Assistant:

void incrementChunk(size_type howmuch) {
        bytesRemaining_ -= howmuch;
        chunkPos_ += howmuch;
        if(chunkPos_ == iter_->dataSize()) {
            chunkPos_ = 0;
            ++iter_;
        }
    }